

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

Node48 * duckdb::Node48::GrowNode16(ART *art,Node *node48,Node *node16)

{
  byte *pbVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  type paVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  Node48 *pNVar7;
  ulong uVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  
  uVar8 = (node16->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar8 & 0xffffffff;
  plVar5 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar5; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar5 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  lVar11 = (ulong)((uint)(uVar8 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  iVar3 = (_Var2._M_head_impl)->bitmask_offset;
  pbVar1 = pdVar6 + iVar3 + lVar11;
  pNVar7 = New(art,node48);
  (node48->super_IndexPointer).data =
       (node16->super_IndexPointer).data & 0x8000000000000000 |
       (node48->super_IndexPointer).data & 0x7fffffffffffffff;
  pNVar7->count = pdVar6[iVar3 + lVar11];
  switchD_0130b471::default(pNVar7->child_index,0x30,0x100);
  uVar8 = (ulong)pdVar6[iVar3 + lVar11];
  if (pdVar6[iVar3 + lVar11] != 0) {
    uVar9 = 0;
    do {
      pNVar7->child_index[pbVar1[uVar9 + 1]] = (uint8_t)uVar9;
      pNVar7->children[uVar9].super_IndexPointer.data = *(idx_t *)(pbVar1 + uVar9 * 8 + 0x18);
      uVar9 = uVar9 + 1;
      uVar8 = (ulong)*pbVar1;
    } while (uVar9 < uVar8);
  }
  if ((byte)uVar8 < 0x30) {
    switchD_0130b471::default(pNVar7->children + uVar8,0,(ulong)(byte)(0x2f - (byte)uVar8) * 8 + 8);
  }
  *pbVar1 = 0;
  Node::Free(art,node16);
  return pNVar7;
}

Assistant:

Node48 &Node48::GrowNode16(ART &art, Node &node48, Node &node16) {
	auto &n16 = Node::Ref<Node16>(art, node16, NType::NODE_16);
	auto &n48 = New(art, node48);
	node48.SetGateStatus(node16.GetGateStatus());

	n48.count = n16.count;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		n48.child_index[i] = EMPTY_MARKER;
	}
	for (uint8_t i = 0; i < n16.count; i++) {
		n48.child_index[n16.key[i]] = i;
		n48.children[i] = n16.children[i];
	}
	for (uint8_t i = n16.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n16.count = 0;
	Node::Free(art, node16);
	return n48;
}